

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptLibrary.cpp
# Opt level: O0

void __thiscall Js::JavascriptLibrary::EnqueueTask(JavascriptLibrary *this,Var taskVar)

{
  EventLog *this_00;
  Type p_Var1;
  code *pcVar2;
  bool bVar3;
  int iVar4;
  undefined4 *puVar5;
  ScriptContext **ppSVar6;
  ScriptContext *pSVar7;
  EventLogEntry *evt_00;
  ThreadContext *pTVar8;
  void **ppvVar9;
  HostScriptContext *pHVar10;
  Type *pTVar11;
  undefined1 local_b0 [4];
  HRESULT hr;
  AutoReentrancyHandler autoReentrancyHandler_1;
  LeaveScriptObject<true,_true,_false> __leaveScriptObject_1;
  void *__frameAddr_1;
  undefined1 local_60 [8];
  AutoReentrancyHandler autoReentrancyHandler;
  LeaveScriptObject<true,_true,_false> __leaveScriptObject;
  void *__frameAddr;
  EventLogEntry *evt;
  Var taskVar_local;
  JavascriptLibrary *this_local;
  
  bVar3 = VarIs<Js::JavascriptFunction>(taskVar);
  if (!bVar3) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptLibrary.cpp"
                                ,0x1424,"(VarIs<JavascriptFunction>(taskVar))",
                                "VarIs<JavascriptFunction>(taskVar)");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  if (this->nativeHostPromiseContinuationFunction == (Type)0x0) {
    pSVar7 = Memory::WriteBarrierPtr<Js::ScriptContext>::operator->
                       (&(this->super_JavascriptLibraryBase).scriptContext);
    bVar3 = ScriptContext::ShouldPerformRecordOrReplayAction(pSVar7);
    if (bVar3) {
      TTDAbort_unrecoverable_error("Path not implemented in TTD!!!");
    }
    pSVar7 = Memory::WriteBarrierPtr<Js::ScriptContext>::operator->
                       (&(this->super_JavascriptLibraryBase).scriptContext);
    pHVar10 = ScriptContext::GetHostScriptContext(pSVar7);
    iVar4 = (*pHVar10->_vptr_HostScriptContext[0x11])(pHVar10,taskVar);
    if (iVar4 != 0) {
      ppSVar6 = Memory::WriteBarrierPtr::operator_cast_to_ScriptContext__
                          ((WriteBarrierPtr *)&(this->super_JavascriptLibraryBase).scriptContext);
      JavascriptError::MapAndThrowError(*ppSVar6,-0x7ff5e9bc);
    }
  }
  else {
    ppSVar6 = Memory::WriteBarrierPtr::operator_cast_to_ScriptContext__
                        ((WriteBarrierPtr *)&(this->super_JavascriptLibraryBase).scriptContext);
    if (*ppSVar6 == (ScriptContext *)0x0) {
      TTDAbort_unrecoverable_error("We shouldn\'t be adding tasks if this is the case???");
    }
    pSVar7 = Memory::WriteBarrierPtr<Js::ScriptContext>::operator->
                       (&(this->super_JavascriptLibraryBase).scriptContext);
    bVar3 = ScriptContext::ShouldPerformReplayAction(pSVar7);
    if (bVar3) {
      pSVar7 = Memory::WriteBarrierPtr<Js::ScriptContext>::operator->
                         (&(this->super_JavascriptLibraryBase).scriptContext);
      pTVar8 = ScriptContext::GetThreadContext(pSVar7);
      pTVar8->TTDRootNestingCount = pTVar8->TTDRootNestingCount + 1;
      pSVar7 = Memory::WriteBarrierPtr<Js::ScriptContext>::operator->
                         (&(this->super_JavascriptLibraryBase).scriptContext);
      pTVar8 = ScriptContext::GetThreadContext(pSVar7);
      this_00 = pTVar8->TTDLog;
      ppSVar6 = Memory::WriteBarrierPtr::operator_cast_to_ScriptContext__
                          ((WriteBarrierPtr *)&(this->super_JavascriptLibraryBase).scriptContext);
      TTD::EventLog::ReplayEnqueueTaskEvent(this_00,*ppSVar6,taskVar);
      pSVar7 = Memory::WriteBarrierPtr<Js::ScriptContext>::operator->
                         (&(this->super_JavascriptLibraryBase).scriptContext);
      pTVar8 = ScriptContext::GetThreadContext(pSVar7);
      pTVar8->TTDRootNestingCount = pTVar8->TTDRootNestingCount + -1;
    }
    else {
      pSVar7 = Memory::WriteBarrierPtr<Js::ScriptContext>::operator->
                         (&(this->super_JavascriptLibraryBase).scriptContext);
      bVar3 = ScriptContext::ShouldPerformRecordAction(pSVar7);
      if (bVar3) {
        pTVar11 = &(this->super_JavascriptLibraryBase).scriptContext;
        pSVar7 = Memory::WriteBarrierPtr<Js::ScriptContext>::operator->(pTVar11);
        pTVar8 = ScriptContext::GetThreadContext(pSVar7);
        pTVar8->TTDRootNestingCount = pTVar8->TTDRootNestingCount + 1;
        pSVar7 = Memory::WriteBarrierPtr<Js::ScriptContext>::operator->(pTVar11);
        pTVar8 = ScriptContext::GetThreadContext(pSVar7);
        evt_00 = TTD::EventLog::RecordEnqueueTaskEvent(pTVar8->TTDLog,taskVar);
        ppSVar6 = Memory::WriteBarrierPtr::operator_cast_to_ScriptContext__
                            ((WriteBarrierPtr *)pTVar11);
        LeaveScriptObject<true,_true,_false>::LeaveScriptObject
                  ((LeaveScriptObject<true,_true,_false> *)
                   &autoReentrancyHandler.m_savedReentrancySafeOrHandled,*ppSVar6,&this_local);
        pSVar7 = Memory::WriteBarrierPtr<Js::ScriptContext>::operator->(pTVar11);
        pTVar8 = ScriptContext::GetThreadContext(pSVar7);
        AutoReentrancyHandler::AutoReentrancyHandler((AutoReentrancyHandler *)local_60,pTVar8);
        p_Var1 = this->nativeHostPromiseContinuationFunction;
        ppvVar9 = Memory::WriteBarrierPtr::operator_cast_to_void__
                            ((WriteBarrierPtr *)&this->nativeHostPromiseContinuationFunctionState);
        (*p_Var1)(taskVar,*ppvVar9);
        ppSVar6 = Memory::WriteBarrierPtr::operator_cast_to_ScriptContext__
                            ((WriteBarrierPtr *)&(this->super_JavascriptLibraryBase).scriptContext);
        if (*ppSVar6 != (ScriptContext *)0x0) {
          pSVar7 = Memory::WriteBarrierPtr<Js::ScriptContext>::operator->
                             (&(this->super_JavascriptLibraryBase).scriptContext);
          pTVar8 = ScriptContext::GetThreadContext(pSVar7);
          ThreadContext::DisposeOnLeaveScript(pTVar8);
        }
        AutoReentrancyHandler::~AutoReentrancyHandler((AutoReentrancyHandler *)local_60);
        LeaveScriptObject<true,_true,_false>::~LeaveScriptObject
                  ((LeaveScriptObject<true,_true,_false> *)
                   &autoReentrancyHandler.m_savedReentrancySafeOrHandled);
        pSVar7 = Memory::WriteBarrierPtr<Js::ScriptContext>::operator->
                           (&(this->super_JavascriptLibraryBase).scriptContext);
        pTVar8 = ScriptContext::GetThreadContext(pSVar7);
        TTD::EventLog::RecordEnqueueTaskEvent_Complete(pTVar8->TTDLog,evt_00);
        pSVar7 = Memory::WriteBarrierPtr<Js::ScriptContext>::operator->
                           (&(this->super_JavascriptLibraryBase).scriptContext);
        pTVar8 = ScriptContext::GetThreadContext(pSVar7);
        pTVar8->TTDRootNestingCount = pTVar8->TTDRootNestingCount + -1;
      }
      else {
        pTVar11 = &(this->super_JavascriptLibraryBase).scriptContext;
        ppSVar6 = Memory::WriteBarrierPtr::operator_cast_to_ScriptContext__
                            ((WriteBarrierPtr *)pTVar11);
        LeaveScriptObject<true,_true,_false>::LeaveScriptObject
                  ((LeaveScriptObject<true,_true,_false> *)
                   &autoReentrancyHandler_1.m_savedReentrancySafeOrHandled,*ppSVar6,&this_local);
        pSVar7 = Memory::WriteBarrierPtr<Js::ScriptContext>::operator->(pTVar11);
        pTVar8 = ScriptContext::GetThreadContext(pSVar7);
        AutoReentrancyHandler::AutoReentrancyHandler((AutoReentrancyHandler *)local_b0,pTVar8);
        p_Var1 = this->nativeHostPromiseContinuationFunction;
        ppvVar9 = Memory::WriteBarrierPtr::operator_cast_to_void__
                            ((WriteBarrierPtr *)&this->nativeHostPromiseContinuationFunctionState);
        (*p_Var1)(taskVar,*ppvVar9);
        ppSVar6 = Memory::WriteBarrierPtr::operator_cast_to_ScriptContext__
                            ((WriteBarrierPtr *)&(this->super_JavascriptLibraryBase).scriptContext);
        if (*ppSVar6 != (ScriptContext *)0x0) {
          pSVar7 = Memory::WriteBarrierPtr<Js::ScriptContext>::operator->
                             (&(this->super_JavascriptLibraryBase).scriptContext);
          pTVar8 = ScriptContext::GetThreadContext(pSVar7);
          ThreadContext::DisposeOnLeaveScript(pTVar8);
        }
        AutoReentrancyHandler::~AutoReentrancyHandler((AutoReentrancyHandler *)local_b0);
        LeaveScriptObject<true,_true,_false>::~LeaveScriptObject
                  ((LeaveScriptObject<true,_true,_false> *)
                   &autoReentrancyHandler_1.m_savedReentrancySafeOrHandled);
      }
    }
  }
  return;
}

Assistant:

void JavascriptLibrary::EnqueueTask(Var taskVar)
    {
        Assert(VarIs<JavascriptFunction>(taskVar));

        if(this->nativeHostPromiseContinuationFunction)
        {
#if ENABLE_TTD
            TTDAssert(this->scriptContext != nullptr, "We shouldn't be adding tasks if this is the case???");

            if(this->scriptContext->ShouldPerformReplayAction())
            {
                this->scriptContext->GetThreadContext()->TTDRootNestingCount++;

                this->scriptContext->GetThreadContext()->TTDLog->ReplayEnqueueTaskEvent(scriptContext, taskVar);

                this->scriptContext->GetThreadContext()->TTDRootNestingCount--;
            }
            else if(this->scriptContext->ShouldPerformRecordAction())
            {
                this->scriptContext->GetThreadContext()->TTDRootNestingCount++;
                TTD::NSLogEvents::EventLogEntry* evt = this->scriptContext->GetThreadContext()->TTDLog->RecordEnqueueTaskEvent(taskVar);

                BEGIN_LEAVE_SCRIPT(this->scriptContext);
                try
                {
                    this->nativeHostPromiseContinuationFunction(taskVar, this->nativeHostPromiseContinuationFunctionState);
                }
                catch(...)
                {
                    // Hosts are required not to pass exceptions back across the callback boundary. If
                    // this happens, it is a bug in the host, not something that we are expected to
                    // handle gracefully.
                    Js::Throw::FatalInternalError();
                }
                END_LEAVE_SCRIPT(this->scriptContext);

                this->scriptContext->GetThreadContext()->TTDLog->RecordEnqueueTaskEvent_Complete(evt);
                this->scriptContext->GetThreadContext()->TTDRootNestingCount--;
            }
            else
            {
                BEGIN_LEAVE_SCRIPT(scriptContext);
                try
                {
                    this->nativeHostPromiseContinuationFunction(taskVar, this->nativeHostPromiseContinuationFunctionState);
                }
                catch(...)
                {
                    // Hosts are required not to pass exceptions back across the callback boundary. If
                    // this happens, it is a bug in the host, not something that we are expected to
                    // handle gracefully.
                    Js::Throw::FatalInternalError();
                }
                END_LEAVE_SCRIPT(scriptContext);
            }
#else
            BEGIN_LEAVE_SCRIPT(scriptContext);
            try
            {
                this->nativeHostPromiseContinuationFunction(taskVar, this->nativeHostPromiseContinuationFunctionState);
            }
            catch (...)
            {
                // Hosts are required not to pass exceptions back across the callback boundary. If
                // this happens, it is a bug in the host, not something that we are expected to
                // handle gracefully.
                Js::Throw::FatalInternalError();
            }
            END_LEAVE_SCRIPT(scriptContext);
#endif
        }
        else
        {
#if ENABLE_TTD
            if(this->scriptContext->ShouldPerformRecordOrReplayAction())
            {
                //
                //TODO: need to implement support for this path
                //
                TTDAssert(false, "Path not implemented in TTD!!!");
            }
#endif

            HRESULT hr = scriptContext->GetHostScriptContext()->EnqueuePromiseTask(taskVar);
            if (hr != S_OK)
            {
                Js::JavascriptError::MapAndThrowError(scriptContext, JSERR_HostMaybeMissingPromiseContinuationCallback);
            }
        }
    }